

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O1

void __thiscall
cornerstone::raft_server::handle_install_snapshot_resp(raft_server *this,resp_msg *resp)

{
  mutex *__mutex;
  ulong uVar1;
  peer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar3;
  ulong uVar4;
  int iVar5;
  _Hash_node_base *p_Var6;
  size_t sVar7;
  undefined4 extraout_var;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  bool bVar11;
  bool bVar12;
  ptr<snapshot> nil_snp;
  long *local_d0 [2];
  long local_c0 [2];
  pthread_mutex_t *local_b0;
  ptr<snapshot> local_a8;
  element_type local_98 [2];
  char *local_40;
  
  std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base);
  iVar5 = (resp->super_msg_base).src_;
  uVar1 = (this->peers_)._M_h._M_bucket_count;
  uVar8 = (ulong)(long)iVar5 % uVar1;
  p_Var9 = (this->peers_)._M_h._M_buckets[uVar8];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var9->_M_nxt, p_Var10 = p_Var9, iVar5 != *(int *)&p_Var9->_M_nxt[1]._M_nxt)) {
    while (p_Var9 = p_Var6, p_Var6 = p_Var9->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var6[1]._M_nxt % uVar1 != uVar8) ||
         (p_Var10 = p_Var9, iVar5 == *(int *)&p_Var6[1]._M_nxt)) goto LAB_001514a4;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_001514a4:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var10->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    peVar3 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40 = "the response is from an unkonw peer %d";
    snprintf((char *)&local_a8,100,"the response is from an unkonw peer %d");
    local_d0[0] = local_c0;
    sVar7 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,&local_a8,
               (long)&local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + sVar7);
    (*peVar3->_vptr_logger[3])(peVar3,local_d0);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
  }
  else {
    this_00 = (peer *)p_Var6[2]._M_nxt;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[3]._M_nxt;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    if (resp->accepted_ == true) {
      __mutex = &this_00->lock_;
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      peVar2 = (this_00->snp_sync_ctx_).
               super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      this_02 = (this_00->snp_sync_ctx_).
                super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      local_b0 = (pthread_mutex_t *)__mutex;
      if (peVar2 == (element_type *)0x0) {
        peVar3 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"no snapshot sync context for this peer, drop the response",
                   "");
        (*peVar3->_vptr_logger[3])(peVar3,&local_a8);
        if (local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            local_98) {
          operator_delete(local_a8.
                          super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,local_98[0].last_log_idx_ + 1);
        }
        bVar11 = true;
      }
      else {
        peVar3 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (resp->next_idx_ <
            *(ulong *)((long)(peVar2->snapshot_).
                             super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 0x10)) {
          local_40 = "continue to sync snapshot at offset %llu";
          snprintf((char *)&local_a8,100,"continue to sync snapshot at offset %llu");
          local_d0[0] = local_c0;
          sVar7 = strlen((char *)&local_a8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,&local_a8,
                     (long)&local_a8.
                            super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + sVar7);
          (*peVar3->_vptr_logger[2])(peVar3,local_d0);
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          peVar2->offset_ = resp->next_idx_;
          bVar11 = false;
        }
        else {
          local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"snapshot sync is done","");
          (*peVar3->_vptr_logger[2])(peVar3,&local_a8);
          if (local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != local_98) {
            operator_delete(local_a8.
                            super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,local_98[0].last_log_idx_ + 1);
          }
          local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          uVar4 = ((peVar2->snapshot_).
                   super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  last_log_idx_;
          this_00->next_log_idx_ = uVar4 + 1;
          this_00->matched_idx_ = uVar4;
          peer::set_snapshot_in_sync(this_00,&local_a8);
          bVar11 = false;
          LOCK();
          bVar12 = (this_00->pending_commit_flag_)._M_base._M_i == true;
          if (bVar12) {
            (this_00->pending_commit_flag_)._M_base._M_i = false;
          }
          UNLOCK();
          if (!bVar12) {
            uVar1 = resp->next_idx_;
            iVar5 = (*((this->log_store_).
                       super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->_vptr_log_store[2])();
            bVar11 = CONCAT44(extraout_var,iVar5) <= uVar1;
          }
          if (local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.
                       super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      pthread_mutex_unlock(local_b0);
    }
    else {
      peVar3 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"peer declines to install the snapshot, will retry","");
      (*peVar3->_vptr_logger[3])(peVar3,&local_a8);
      if (local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          local_98) {
        operator_delete(local_a8.
                        super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,local_98[0].last_log_idx_ + 1);
      }
      bVar11 = false;
    }
    if ((!bVar11) && (this->role_ == leader)) {
      request_append_entries(this,this_00);
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp(resp_msg& resp)
{
    read_lock(peers_lock_);
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end())
    {
        l_->info(sstrfmt("the response is from an unkonw peer %d").fmt(resp.get_src()));
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced, continue to send appendEntries to
    // this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted())
    {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ptr<snapshot_sync_ctx> sync_ctx = p->get_snapshot_sync_ctx();
        if (sync_ctx == nilptr)
        {
            l_->info("no snapshot sync context for this peer, drop the response");
            need_to_catchup = false;
        }
        else
        {
            if (resp.get_next_idx() >= sync_ctx->get_snapshot()->size())
            {
                l_->debug("snapshot sync is done");
                ptr<snapshot> nil_snp;
                p->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                p->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
                p->set_snapshot_in_sync(nil_snp);
                need_to_catchup = p->clear_pending_commit() || resp.get_next_idx() < log_store_->next_slot();
            }
            else
            {
                l_->debug(sstrfmt("continue to sync snapshot at offset %llu").fmt(resp.get_next_idx()));
                sync_ctx->set_offset(resp.get_next_idx());
            }
        }
    }
    else
    {
        l_->info("peer declines to install the snapshot, will retry");
    }

    // This may not be a leader anymore, such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup)
    {
        request_append_entries(*p);
    }
}